

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O1

bool ParseFixedPoint(string_view val,int decimals,int64_t *amount_out)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long in_FS_OFFSET;
  bool bVar17;
  
  pcVar7 = val._M_str;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = (uint)val._M_len;
  if ((int)uVar9 < 1) {
    uVar10 = 0;
  }
  else {
    uVar10 = (ulong)(*pcVar7 == '-');
  }
  uVar6 = (uint)uVar10;
  if ((int)uVar6 < (int)uVar9) {
    if (pcVar7[uVar10] == '0') {
      lVar8 = 0;
      iVar3 = 0;
      uVar6 = uVar6 + 1;
    }
    else {
      iVar3 = 0;
      bVar17 = false;
      if (8 < (byte)(pcVar7[uVar10] - 0x31U)) goto LAB_00e1ff39;
      if ((int)uVar6 < (int)uVar9) {
        iVar3 = 0;
        lVar8 = 0;
        uVar4 = uVar10;
        do {
          bVar1 = pcVar7[uVar4];
          if (9 < (byte)(bVar1 - 0x30)) {
            uVar6 = (uint)uVar4;
            break;
          }
          if (bVar1 == 0x30) {
            iVar3 = iVar3 + 1;
            bVar17 = true;
          }
          else {
            if (-1 < iVar3) {
              if (lVar8 < 100000000000000000) {
                iVar12 = 1;
                lVar5 = lVar8;
                do {
                  lVar8 = lVar5 * 10;
                  if (iVar3 + iVar12 == 1) goto LAB_00e1fde4;
                  iVar12 = iVar12 + -1;
                  bVar17 = lVar5 < 10000000000000000;
                  lVar5 = lVar8;
                } while (bVar17);
                bVar17 = iVar3 <= -iVar12;
              }
              else {
                bVar17 = false;
              }
              if (!bVar17) {
                bVar17 = false;
                goto LAB_00e1fdf0;
              }
            }
LAB_00e1fde4:
            lVar8 = lVar8 + (ulong)bVar1 + -0x30;
            bVar17 = true;
            iVar3 = 0;
          }
LAB_00e1fdf0:
          if (!bVar17) goto LAB_00e1ff37;
          uVar4 = uVar4 + 1;
          uVar6 = uVar9;
        } while (uVar4 != uVar9);
      }
      else {
        lVar8 = 0;
      }
    }
    if (((int)uVar6 < (int)uVar9) && (lVar5 = (long)(int)uVar6, pcVar7[lVar5] == '.')) {
      uVar14 = (uint)(lVar5 + 1);
      if (((int)uVar9 <= (int)uVar14) || (9 < (byte)(pcVar7[lVar5 + 1] - 0x30U))) goto LAB_00e1ff37;
      uVar4 = 0;
      if ((int)uVar14 < (int)uVar9) {
        uVar6 = ~uVar6 + uVar9;
        do {
          bVar1 = pcVar7[lVar5 + 1];
          lVar5 = lVar5 + 1;
          if (9 < (byte)(bVar1 - 0x30)) {
            uVar6 = (uint)uVar4;
            uVar14 = (uint)lVar5;
            break;
          }
          if (bVar1 == 0x30) {
            iVar3 = iVar3 + 1;
            bVar17 = true;
          }
          else {
            if (-1 < iVar3) {
              if (lVar8 < 100000000000000000) {
                iVar12 = 1;
                lVar16 = lVar8;
                do {
                  lVar8 = lVar16 * 10;
                  if (iVar3 + iVar12 == 1) goto LAB_00e1fcd6;
                  iVar12 = iVar12 + -1;
                  bVar17 = lVar16 < 10000000000000000;
                  lVar16 = lVar8;
                } while (bVar17);
                bVar17 = iVar3 <= -iVar12;
              }
              else {
                bVar17 = false;
              }
              if (!bVar17) {
                bVar17 = false;
                goto LAB_00e1fce2;
              }
            }
LAB_00e1fcd6:
            lVar8 = lVar8 + (ulong)bVar1 + -0x30;
            bVar17 = true;
            iVar3 = 0;
          }
LAB_00e1fce2:
          if (!bVar17) goto LAB_00e1ff37;
          uVar11 = (uint)uVar4 + 1;
          uVar4 = (ulong)uVar11;
          uVar14 = uVar9;
        } while (uVar11 != uVar6);
        uVar4 = (ulong)uVar6;
      }
    }
    else {
      uVar4 = 0;
      uVar14 = uVar6;
    }
    if (((int)uVar14 < (int)uVar9) && ((byte)(pcVar7[(int)uVar14] | 0x20U) == 0x65)) {
      uVar15 = (long)(int)uVar14 + 1;
      if ((int)(uint)uVar15 < (int)uVar9) {
        uVar6 = uVar14 + 2;
        if (pcVar7[uVar15] == '+') {
          bVar17 = false;
        }
        else {
          bVar17 = pcVar7[uVar15] == '-';
          if (!bVar17) {
            uVar6 = (uint)uVar15;
          }
        }
        uVar15 = (ulong)uVar6;
      }
      else {
        bVar17 = false;
      }
      uVar6 = (uint)uVar15;
      if (((int)uVar9 <= (int)uVar6) ||
         (lVar16 = (long)(int)uVar6, 9 < (byte)(pcVar7[lVar16] - 0x30U))) goto LAB_00e1ff37;
      if ((int)uVar6 < (int)uVar9) {
        lVar13 = 0;
        lVar5 = 0;
        do {
          if (9 < (byte)(pcVar7[lVar13 + lVar16] - 0x30U)) {
            uVar14 = uVar6 + (int)lVar13;
            break;
          }
          if (99999999999999999 < lVar5) goto LAB_00e1ff37;
          lVar5 = lVar5 * 10 + -0x30 + (ulong)(byte)pcVar7[lVar13 + lVar16];
          lVar13 = lVar13 + 1;
          uVar14 = uVar9;
        } while ((int)uVar9 - lVar16 != lVar13);
      }
      else {
        lVar5 = 0;
        uVar14 = uVar6;
      }
    }
    else {
      lVar5 = 0;
      bVar17 = false;
    }
    if (uVar14 == uVar9) {
      lVar16 = -lVar5;
      if (!bVar17) {
        lVar16 = lVar5;
      }
      uVar4 = (((long)decimals + (long)iVar3) - uVar4) + lVar16;
      if (uVar4 < 0x12) {
        lVar5 = -lVar8;
        if ((char)uVar10 == '\0') {
          lVar5 = lVar8;
        }
        if (uVar4 != 0) {
          lVar8 = 0;
          do {
            if (lVar5 + 0xfe9cba87a2760000U < 0xfd39750f44ec0001) goto LAB_00e1ff37;
            lVar5 = lVar5 * 10;
            lVar8 = lVar8 + 1;
          } while (lVar8 < (long)uVar4);
        }
        if (0xe43e9298b1380000 < lVar5 + 0xf21f494c589c0000U) {
          bVar17 = true;
          if (amount_out != (int64_t *)0x0) {
            *amount_out = lVar5;
          }
          goto LAB_00e1ff39;
        }
      }
    }
  }
LAB_00e1ff37:
  bVar17 = false;
LAB_00e1ff39:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar17;
}

Assistant:

bool ParseFixedPoint(std::string_view val, int decimals, int64_t *amount_out)
{
    int64_t mantissa = 0;
    int64_t exponent = 0;
    int mantissa_tzeros = 0;
    bool mantissa_sign = false;
    bool exponent_sign = false;
    int ptr = 0;
    int end = val.size();
    int point_ofs = 0;

    if (ptr < end && val[ptr] == '-') {
        mantissa_sign = true;
        ++ptr;
    }
    if (ptr < end)
    {
        if (val[ptr] == '0') {
            /* pass single 0 */
            ++ptr;
        } else if (val[ptr] >= '1' && val[ptr] <= '9') {
            while (ptr < end && IsDigit(val[ptr])) {
                if (!ProcessMantissaDigit(val[ptr], mantissa, mantissa_tzeros))
                    return false; /* overflow */
                ++ptr;
            }
        } else return false; /* missing expected digit */
    } else return false; /* empty string or loose '-' */
    if (ptr < end && val[ptr] == '.')
    {
        ++ptr;
        if (ptr < end && IsDigit(val[ptr]))
        {
            while (ptr < end && IsDigit(val[ptr])) {
                if (!ProcessMantissaDigit(val[ptr], mantissa, mantissa_tzeros))
                    return false; /* overflow */
                ++ptr;
                ++point_ofs;
            }
        } else return false; /* missing expected digit */
    }
    if (ptr < end && (val[ptr] == 'e' || val[ptr] == 'E'))
    {
        ++ptr;
        if (ptr < end && val[ptr] == '+')
            ++ptr;
        else if (ptr < end && val[ptr] == '-') {
            exponent_sign = true;
            ++ptr;
        }
        if (ptr < end && IsDigit(val[ptr])) {
            while (ptr < end && IsDigit(val[ptr])) {
                if (exponent > (UPPER_BOUND / 10LL))
                    return false; /* overflow */
                exponent = exponent * 10 + val[ptr] - '0';
                ++ptr;
            }
        } else return false; /* missing expected digit */
    }
    if (ptr != end)
        return false; /* trailing garbage */

    /* finalize exponent */
    if (exponent_sign)
        exponent = -exponent;
    exponent = exponent - point_ofs + mantissa_tzeros;

    /* finalize mantissa */
    if (mantissa_sign)
        mantissa = -mantissa;

    /* convert to one 64-bit fixed-point value */
    exponent += decimals;
    if (exponent < 0)
        return false; /* cannot represent values smaller than 10^-decimals */
    if (exponent >= 18)
        return false; /* cannot represent values larger than or equal to 10^(18-decimals) */

    for (int i=0; i < exponent; ++i) {
        if (mantissa > (UPPER_BOUND / 10LL) || mantissa < -(UPPER_BOUND / 10LL))
            return false; /* overflow */
        mantissa *= 10;
    }
    if (mantissa > UPPER_BOUND || mantissa < -UPPER_BOUND)
        return false; /* overflow */

    if (amount_out)
        *amount_out = mantissa;

    return true;
}